

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_ULong FT_Get_CMap_Language_ID(FT_CharMap charmap)

{
  FT_Driver pFVar1;
  FT_Module_Requester p_Var2;
  int iVar3;
  undefined8 *puVar4;
  TT_CMapInfo cmap_info;
  FT_ULong local_18 [2];
  
  if (charmap == (FT_CharMap)0x0) {
    return 0;
  }
  if (charmap->face != (FT_Face)0x0) {
    pFVar1 = charmap->face->driver;
    p_Var2 = ((pFVar1->root).clazz)->get_interface;
    if (((p_Var2 != (FT_Module_Requester)0x0) &&
        (puVar4 = (undefined8 *)(*p_Var2)(&pFVar1->root,"tt-cmaps"), puVar4 != (undefined8 *)0x0))
       && (iVar3 = (*(code *)*puVar4)(charmap,local_18), iVar3 == 0)) {
      return local_18[0];
    }
  }
  return 0;
}

Assistant:

FT_EXPORT_DEF( FT_ULong )
  FT_Get_CMap_Language_ID( FT_CharMap  charmap )
  {
    FT_Service_TTCMaps  service;
    FT_Face             face;
    TT_CMapInfo         cmap_info;


    if ( !charmap || !charmap->face )
      return 0;

    face = charmap->face;
    FT_FACE_FIND_SERVICE( face, service, TT_CMAP );
    if ( !service )
      return 0;
    if ( service->get_cmap_info( charmap, &cmap_info ))
      return 0;

    return cmap_info.language;
  }